

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.cpp
# Opt level: O1

Interaction * __thiscall
phyr::Shape::sample(Interaction *__return_storage_ptr__,Shape *this,Interaction *ref,Point2f *u,
                   double *pdf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  (*this->_vptr_Shape[7])(__return_storage_ptr__,this,u,pdf);
  dVar5 = (__return_storage_ptr__->p).x - (ref->p).x;
  dVar6 = (__return_storage_ptr__->p).y - (ref->p).y;
  dVar7 = (__return_storage_ptr__->p).z - (ref->p).z;
  dVar1 = dVar7 * dVar7 + dVar5 * dVar5 + dVar6 * dVar6;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    dVar3 = (ref->p).x - (__return_storage_ptr__->p).x;
    dVar4 = (ref->p).y - (__return_storage_ptr__->p).y;
    dVar2 = (ref->p).z - (__return_storage_ptr__->p).z;
    dVar1 = 1.0 / dVar1;
    dVar1 = ((dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4) /
            ABS((dVar5 * -dVar1 * (__return_storage_ptr__->n).x -
                dVar6 * dVar1 * (__return_storage_ptr__->n).y) -
                dVar7 * dVar1 * (__return_storage_ptr__->n).z)) * *pdf;
    if (ABS(dVar1) != INFINITY) goto LAB_00139d48;
  }
  dVar1 = 0.0;
LAB_00139d48:
  *pdf = dVar1;
  return __return_storage_ptr__;
}

Assistant:

Interaction Shape::sample(const Interaction& ref, const Point2f& u,
                          Real* pdf) const {
    Interaction intr = sample(u, pdf);
    Vector3f wi = intr.p - ref.p;
    if (wi.lengthSquared() == 0)
        *pdf = 0;
    else {
        wi = normalize(wi);
        // Convert from area measure, as returned by the Sample() call
        // above, to solid angle measure.
        *pdf *= distanceSquared(ref.p, intr.p) / absDot(intr.n, -wi);
        if (std::isinf(*pdf)) *pdf = 0.f;
    }
    return intr;
}